

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O0

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  undefined8 *puVar14;
  int iVar15;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128 _p128_3;
  __m128 _slope128_3;
  float slope_3;
  int i_5;
  float *ptr_3;
  int q;
  int size_2;
  __m128 _p128_2;
  __m128 _slope128_2;
  float slope_2;
  int j;
  float *ptr_2;
  int i_4;
  int size_1;
  int i_3;
  __m128 _slope128_1;
  __m128 _p128_1;
  int i_2;
  int ii_1;
  int remain_size_start_1;
  int nn_size_1;
  float slope_1;
  float *ptr_1;
  int i_1;
  __m128 _slope128;
  __m128 _p128;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  float *slope;
  float *ptr;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  __m128 neg_3;
  __m128 pos_3;
  __m128 neg_2;
  __m128 pos_2;
  __m128 neg_1;
  __m128 pos_1;
  __m128 neg;
  __m128 pos;
  Mat *m;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  float local_7d4;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  float local_794;
  int local_760;
  undefined1 (*local_708) [16];
  int local_700;
  int local_6d4;
  undefined1 (*local_6d0) [16];
  int local_6c4;
  int local_6bc;
  int local_688;
  int local_66c;
  int local_63c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  iVar13 = (int)in_RSI[5];
  iVar5 = *(int *)((long)in_RSI + 0x2c);
  lVar11 = in_RSI[6];
  lVar12 = in_RSI[7];
  iVar6 = (int)in_RSI[3];
  if (iVar13 == 1) {
    iVar15 = iVar5 * iVar6;
    if (*(int *)(in_RDI + 0xd0) < 2) {
      lVar7 = *in_RSI;
      fVar4 = **(float **)(in_RDI + 0xd8);
      for (local_688 = 0; local_688 < iVar15 / 4; local_688 = local_688 + 1) {
        pauVar2 = (undefined1 (*) [16])(lVar7 + (long)(local_688 * 4) * 4);
        puVar14 = (undefined8 *)(lVar7 + (long)(local_688 * 4) * 4);
        auVar17 = maxps(ZEXT816(0),*pauVar2);
        auVar16 = minps(ZEXT816(0),*pauVar2);
        local_f8 = auVar16._0_4_;
        fStack_f4 = auVar16._4_4_;
        fStack_f0 = auVar16._8_4_;
        fStack_ec = auVar16._12_4_;
        local_168 = auVar17._0_4_;
        fStack_164 = auVar17._4_4_;
        fStack_160 = auVar17._8_4_;
        fStack_15c = auVar17._12_4_;
        *puVar14 = CONCAT44(fStack_164 + fVar4 * fStack_f4,local_168 + fVar4 * local_f8);
        puVar14[1] = CONCAT44(fStack_15c + fVar4 * fStack_ec,fStack_160 + fVar4 * fStack_f0);
      }
      for (local_6bc = (iVar15 / 4) * 4; local_6bc < iVar15; local_6bc = local_6bc + 1) {
        pfVar3 = (float *)(lVar7 + (long)local_6bc * 4);
        if (*pfVar3 <= 0.0 && *pfVar3 != 0.0) {
          *(float *)(lVar7 + (long)local_6bc * 4) = fVar4 * *(float *)(lVar7 + (long)local_6bc * 4);
        }
      }
    }
    else {
      lVar7 = *in_RSI;
      lVar8 = *(long *)(in_RDI + 0xd8);
      for (local_63c = 0; local_63c < iVar15 / 4; local_63c = local_63c + 1) {
        iVar1 = local_63c * 4;
        pauVar2 = (undefined1 (*) [16])(lVar7 + (long)iVar1 * 4);
        puVar14 = (undefined8 *)(lVar8 + (long)iVar1 * 4);
        uVar9 = *puVar14;
        uVar10 = puVar14[1];
        puVar14 = (undefined8 *)(lVar7 + (long)iVar1 * 4);
        auVar17 = maxps(ZEXT816(0),*pauVar2);
        auVar16 = minps(ZEXT816(0),*pauVar2);
        local_108 = (float)uVar9;
        fStack_104 = (float)((ulong)uVar9 >> 0x20);
        fStack_100 = (float)uVar10;
        fStack_fc = (float)((ulong)uVar10 >> 0x20);
        local_118 = auVar16._0_4_;
        fStack_114 = auVar16._4_4_;
        fStack_110 = auVar16._8_4_;
        fStack_10c = auVar16._12_4_;
        local_188 = auVar17._0_4_;
        fStack_184 = auVar17._4_4_;
        fStack_180 = auVar17._8_4_;
        fStack_17c = auVar17._12_4_;
        *puVar14 = CONCAT44(fStack_184 + fStack_104 * fStack_114,local_188 + local_108 * local_118);
        puVar14[1] = CONCAT44(fStack_17c + fStack_fc * fStack_10c,
                              fStack_180 + fStack_100 * fStack_110);
      }
      for (local_66c = (iVar15 / 4) * 4; local_66c < iVar15; local_66c = local_66c + 1) {
        pfVar3 = (float *)(lVar7 + (long)local_66c * 4);
        if (*pfVar3 <= 0.0 && *pfVar3 != 0.0) {
          *(float *)(lVar7 + (long)local_66c * 4) =
               *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_66c * 4) *
               *(float *)(lVar7 + (long)local_66c * 4);
        }
      }
    }
  }
  if (iVar13 == 2) {
    for (local_6c4 = 0; local_6c4 < (int)lVar11; local_6c4 = local_6c4 + 1) {
      local_6d0 = (undefined1 (*) [16])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_6c4 * in_RSI[2]);
      local_6d4 = 0;
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_794 = **(float **)(in_RDI + 0xd8);
      }
      else {
        local_794 = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_6c4 * 4);
      }
      if ((*(int *)(in_RDI + 0xd0) < 2) || (iVar6 != 4)) {
        local_7a8 = CONCAT44(local_794,local_794);
        uStack_7a0 = CONCAT44(local_794,local_794);
      }
      else {
        puVar14 = (undefined8 *)(*(long *)(in_RDI + 0xd8) + (long)(local_6c4 << 2) * 4);
        local_7a8 = *puVar14;
        uStack_7a0 = puVar14[1];
      }
      for (; local_6d4 + 3 < iVar5 * iVar6; local_6d4 = local_6d4 + 4) {
        auVar17 = maxps(ZEXT816(0),*local_6d0);
        auVar16 = minps(ZEXT816(0),*local_6d0);
        local_c8 = (float)local_7a8;
        fStack_c4 = (float)((ulong)local_7a8 >> 0x20);
        fStack_c0 = (float)uStack_7a0;
        fStack_bc = (float)((ulong)uStack_7a0 >> 0x20);
        local_d8 = auVar16._0_4_;
        fStack_d4 = auVar16._4_4_;
        fStack_d0 = auVar16._8_4_;
        fStack_cc = auVar16._12_4_;
        local_148 = auVar17._0_4_;
        fStack_144 = auVar17._4_4_;
        fStack_140 = auVar17._8_4_;
        fStack_13c = auVar17._12_4_;
        *(ulong *)*local_6d0 =
             CONCAT44(fStack_144 + fStack_c4 * fStack_d4,local_148 + local_c8 * local_d8);
        *(ulong *)(*local_6d0 + 8) =
             CONCAT44(fStack_13c + fStack_bc * fStack_cc,fStack_140 + fStack_c0 * fStack_d0);
        local_6d0 = local_6d0 + 1;
      }
      for (; local_6d4 < iVar5 * iVar6; local_6d4 = local_6d4 + 1) {
        if (*(float *)*local_6d0 <= 0.0 && *(float *)*local_6d0 != 0.0) {
          *(float *)*local_6d0 = local_794 * *(float *)*local_6d0;
        }
        local_6d0 = (undefined1 (*) [16])(*local_6d0 + 4);
      }
    }
  }
  if (iVar13 == 3) {
    iVar13 = iVar5 * (int)lVar11 * iVar6;
    for (local_700 = 0; local_700 < (int)lVar12; local_700 = local_700 + 1) {
      local_708 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_700 * in_RSI[2]);
      local_760 = 0;
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_7d4 = **(float **)(in_RDI + 0xd8);
      }
      else {
        local_7d4 = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_700 * 4);
      }
      if ((*(int *)(in_RDI + 0xd0) < 2) || (iVar6 != 4)) {
        local_7e8 = CONCAT44(local_7d4,local_7d4);
        uStack_7e0 = CONCAT44(local_7d4,local_7d4);
      }
      else {
        puVar14 = (undefined8 *)(*(long *)(in_RDI + 0xd8) + (long)(local_700 << 2) * 4);
        local_7e8 = *puVar14;
        uStack_7e0 = puVar14[1];
      }
      for (; local_760 + 3 < iVar13; local_760 = local_760 + 4) {
        auVar17 = maxps(ZEXT816(0),*local_708);
        auVar16 = minps(ZEXT816(0),*local_708);
        local_a8 = (float)local_7e8;
        fStack_a4 = (float)((ulong)local_7e8 >> 0x20);
        fStack_a0 = (float)uStack_7e0;
        fStack_9c = (float)((ulong)uStack_7e0 >> 0x20);
        local_b8 = auVar16._0_4_;
        fStack_b4 = auVar16._4_4_;
        fStack_b0 = auVar16._8_4_;
        fStack_ac = auVar16._12_4_;
        local_128 = auVar17._0_4_;
        fStack_124 = auVar17._4_4_;
        fStack_120 = auVar17._8_4_;
        fStack_11c = auVar17._12_4_;
        *(ulong *)*local_708 =
             CONCAT44(fStack_124 + fStack_a4 * fStack_b4,local_128 + local_a8 * local_b8);
        *(ulong *)(*local_708 + 8) =
             CONCAT44(fStack_11c + fStack_9c * fStack_ac,fStack_120 + fStack_a0 * fStack_b0);
        local_708 = local_708 + 1;
      }
      for (; local_760 < iVar13; local_760 = local_760 + 1) {
        if (*(float *)*local_708 <= 0.0 && *(float *)*local_708 != 0.0) {
          *(float *)*local_708 = local_7d4 * *(float *)*local_708;
        }
        local_708 = (undefined1 (*) [16])(*local_708 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}